

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellIntrinsics.cpp
# Opt level: O3

IntrinsicResult intrinsic_rawDataResize(Context *context,IntrinsicResult partialResult)

{
  ListStorage<MiniScript::TACLine> *pLVar1;
  bool bVar2;
  int32_t iVar3;
  uint uVar4;
  long *plVar5;
  undefined4 *puVar6;
  anon_union_8_3_2f476f46_for_data aVar7;
  StringStorage *pSVar8;
  char *pcVar9;
  String *msg;
  Value dataWrapper;
  Value self;
  Value v;
  Value local_c8;
  IndexException local_b8;
  ValueType local_88;
  undefined2 local_87;
  anon_union_8_3_2f476f46_for_data local_80;
  String local_78;
  long *local_68;
  char local_60;
  long *local_58;
  anon_union_8_3_2f476f46_for_data local_50;
  undefined1 local_48 [16];
  Value local_38;
  
  local_50.tempNum._0_1_ = '\0';
  plVar5 = (long *)operator_new(0x30);
  plVar5[1] = 1;
  *plVar5 = (long)&PTR__StringStorage_001bf0d8;
  plVar5[3] = 5;
  plVar5[4] = -1;
  puVar6 = (undefined4 *)operator_new__(5);
  plVar5[2] = (long)puVar6;
  *(undefined1 *)(puVar6 + 1) = 0;
  *puVar6 = 0x666c6573;
  local_58 = plVar5;
  MiniScript::Context::GetVar
            ((Context *)local_48,(String *)partialResult.rs,(LocalOnlyMode)&local_58);
  if ((local_58 != (long *)0x0) && (local_50.tempNum._0_1_ == '\0')) {
    plVar5 = local_58 + 1;
    *plVar5 = *plVar5 + -1;
    if (*plVar5 == 0) {
      (**(code **)(*local_58 + 8))();
    }
    local_58 = (long *)0x0;
  }
  local_60 = '\0';
  plVar5 = (long *)operator_new(0x30);
  plVar5[1] = 1;
  *plVar5 = (long)&PTR__StringStorage_001bf0d8;
  plVar5[3] = 6;
  plVar5[4] = -1;
  puVar6 = (undefined4 *)operator_new__(6);
  plVar5[2] = (long)puVar6;
  *(undefined2 *)(puVar6 + 1) = 0x73;
  *puVar6 = 0x65747962;
  local_68 = plVar5;
  MiniScript::Context::GetVar
            ((Context *)&local_b8,(String *)partialResult.rs,(LocalOnlyMode)&local_68);
  iVar3 = MiniScript::Value::IntValue((Value *)&local_b8);
  if ((2 < (byte)local_b8.super_RuntimeException.super_MiniscriptException.super_exception) &&
     (local_b8.super_RuntimeException.super_MiniscriptException.location.context.ss !=
      (StringStorage *)0x0)) {
    plVar5 = (long *)((long)local_b8.super_RuntimeException.super_MiniscriptException.location.
                            context.ss + 8);
    *plVar5 = *plVar5 + -1;
    if (*plVar5 == 0) {
      (*((local_b8.super_RuntimeException.super_MiniscriptException.location.context.ss)->
        super_RefCountedStorage)._vptr_RefCountedStorage[1])();
    }
    local_b8.super_RuntimeException.super_MiniscriptException.location.context.ss =
         (StringStorage *)0x0;
  }
  if ((local_68 != (long *)0x0) && (local_60 == '\0')) {
    plVar5 = local_68 + 1;
    *plVar5 = *plVar5 + -1;
    if (*plVar5 == 0) {
      (**(code **)(*local_68 + 8))();
    }
    local_68 = (long *)0x0;
  }
  if (iVar3 < 0) {
    local_78.isTemp = false;
    pSVar8 = (StringStorage *)operator_new(0x30);
    (pSVar8->super_RefCountedStorage).refCount = 1;
    (pSVar8->super_RefCountedStorage)._vptr_RefCountedStorage =
         (_func_int **)&PTR__StringStorage_001bf0d8;
    pSVar8->dataSize = 0x1d;
    pSVar8->charCount = -1;
    pcVar9 = (char *)operator_new__(0x1d);
    pSVar8->data = pcVar9;
    msg = &local_78;
    builtin_strncpy(pcVar9,"bytes parameter must be >= 0",0x1d);
    local_78.ss = pSVar8;
    MiniScript::IndexException::IndexException(&local_b8,msg);
    MiniScript::IndexException::raise(&local_b8,(int)msg);
    local_b8.super_RuntimeException.super_MiniscriptException._0_8_ =
         &PTR__MiniscriptException_001bf360;
    if (((DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)
         local_b8.super_RuntimeException.super_MiniscriptException.message.ss !=
         (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0) &&
       (local_b8.super_RuntimeException.super_MiniscriptException.message.isTemp == false)) {
      plVar5 = &((local_b8.super_RuntimeException.super_MiniscriptException.message.ss)->
                super_RefCountedStorage).refCount;
      *plVar5 = *plVar5 + -1;
      if (*plVar5 == 0) {
        (*((local_b8.super_RuntimeException.super_MiniscriptException.message.ss)->
          super_RefCountedStorage)._vptr_RefCountedStorage[1])();
      }
      local_b8.super_RuntimeException.super_MiniscriptException.message.ss = (StringStorage *)0x0;
    }
    if ((local_b8.super_RuntimeException.super_MiniscriptException.location.context.ss !=
         (StringStorage *)0x0) &&
       (local_b8.super_RuntimeException.super_MiniscriptException.location.context.isTemp == false))
    {
      plVar5 = (long *)((long)local_b8.super_RuntimeException.super_MiniscriptException.location.
                              context.ss + 8);
      *plVar5 = *plVar5 + -1;
      if (*plVar5 == 0) {
        (*((local_b8.super_RuntimeException.super_MiniscriptException.location.context.ss)->
          super_RefCountedStorage)._vptr_RefCountedStorage[1])();
      }
      local_b8.super_RuntimeException.super_MiniscriptException.location.context.ss =
           (StringStorage *)0x0;
    }
    std::exception::~exception((exception *)&local_b8);
    if ((local_78.ss != (StringStorage *)0x0) && (local_78.isTemp == false)) {
      plVar5 = &((local_78.ss)->super_RefCountedStorage).refCount;
      *plVar5 = *plVar5 + -1;
      if (*plVar5 == 0) {
        (*((local_78.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
      }
      local_78.ss = (StringStorage *)0x0;
    }
  }
  local_88 = _handle.type;
  local_87._0_1_ = _handle.noInvoke;
  local_87._1_1_ = _handle.localOnly;
  local_80 = _handle.data;
  if (_handle.data.ref != (RefCountedStorage *)0x0 && Temp < _handle.type) {
    (_handle.data.ref)->refCount = (_handle.data.ref)->refCount + 1;
  }
  MiniScript::Value::Lookup(&local_c8,(Value *)local_48);
  if ((Temp < local_88) && (local_80.ref != (RefCountedStorage *)0x0)) {
    plVar5 = &(local_80.ref)->refCount;
    *plVar5 = *plVar5 + -1;
    if (*plVar5 == 0) {
      (*(local_80.ref)->_vptr_RefCountedStorage[1])();
    }
    local_80.number = 0.0;
  }
  if (local_c8.type != Handle) {
    local_38.data.ref = (RefCountedStorage *)operator_new(0x20);
    (local_38.data.ref)->refCount = 1;
    ((RefCountedStorage *)&(local_38.data.ref)->_vptr_RefCountedStorage)->_vptr_RefCountedStorage =
         (_func_int **)&PTR__RawDataHandleStorage_001bf570;
    local_38.data.ref[1]._vptr_RefCountedStorage = (_func_int **)0x0;
    local_38.data.ref[1].refCount = 0;
    local_38.localOnly = Off;
    local_38.type = Handle;
    local_38.noInvoke = false;
    MiniScript::Value::operator=(&local_c8,&local_38);
    if ((Temp < local_38.type) &&
       ((ListStorage<MiniScript::Value> *)local_38.data.ref != (ListStorage<MiniScript::Value> *)0x0
       )) {
      plVar5 = &(local_38.data.ref)->refCount;
      *plVar5 = *plVar5 + -1;
      if (*plVar5 == 0) {
        (*((RefCountedStorage *)&(local_38.data.ref)->_vptr_RefCountedStorage)->
          _vptr_RefCountedStorage[1])();
      }
    }
    MiniScript::Value::GetDict((ValueDict *)&local_b8,(Value *)local_48);
    uVar4 = MiniScript::HashValue(&_handle);
    if (local_b8.super_RuntimeException.super_MiniscriptException.location.context.ss ==
        (StringStorage *)0x0) {
      aVar7.ref = (RefCountedStorage *)operator_new(0x800);
      (aVar7.ref)->refCount = 1;
      (aVar7.ref)->_vptr_RefCountedStorage = (_func_int **)&PTR__DictionaryStorage_001bf208;
      memset(aVar7.ref + 1,0,0x7f0);
      local_b8.super_RuntimeException.super_MiniscriptException.location.context.ss =
           (StringStorage *)aVar7.ref;
    }
    uVar4 = uVar4 % 0xfb;
    plVar5 = &((RefCountedStorage *)
              ((long)local_b8.super_RuntimeException.super_MiniscriptException.location.context.ss +
              0x10))->refCount + uVar4;
    do {
      plVar5 = (long *)*plVar5;
      if (plVar5 == (long *)0x0) {
        plVar5 = (long *)operator_new(0x28);
        *(undefined2 *)(plVar5 + 3) = 0;
        *(undefined1 *)((long)plVar5 + 0x1a) = 0;
        *plVar5 = 0;
        *(undefined4 *)((long)plVar5 + 7) = 0;
        MiniScript::Value::operator=((Value *)(plVar5 + 1),&_handle);
        MiniScript::Value::operator=((Value *)(plVar5 + 3),&local_c8);
        *plVar5 = (&((RefCountedStorage *)
                    ((long)local_b8.super_RuntimeException.super_MiniscriptException.location.
                           context.ss + 0x10))->refCount)[uVar4];
        (&((RefCountedStorage *)
          ((long)local_b8.super_RuntimeException.super_MiniscriptException.location.context.ss +
          0x10))->refCount)[uVar4] = (long)plVar5;
        ((RefCountedStorage *)
        ((long)local_b8.super_RuntimeException.super_MiniscriptException.location.context.ss + 0x10)
        )->_vptr_RefCountedStorage =
             (_func_int **)
             ((long)((RefCountedStorage *)
                    ((long)local_b8.super_RuntimeException.super_MiniscriptException.location.
                           context.ss + 0x10))->_vptr_RefCountedStorage + 1);
        goto LAB_0012fb7a;
      }
      bVar2 = MiniScript::Value::operator==((Value *)(plVar5 + 1),&_handle);
    } while (!bVar2);
    MiniScript::Value::operator=((Value *)(plVar5 + 3),&local_c8);
    local_b8.super_RuntimeException.super_MiniscriptException._0_8_ = &PTR__Dictionary_001bf240;
    if (local_b8.super_RuntimeException.super_MiniscriptException.location.context.ss !=
        (StringStorage *)0x0) {
LAB_0012fb7a:
      local_b8.super_RuntimeException.super_MiniscriptException._0_8_ = &PTR__Dictionary_001bf240;
      if (local_b8.super_RuntimeException.super_MiniscriptException.location.context.isTemp == false
         ) {
        plVar5 = (long *)((long)local_b8.super_RuntimeException.super_MiniscriptException.location.
                                context.ss + 8);
        *plVar5 = *plVar5 + -1;
        if (*plVar5 == 0) {
          (*((local_b8.super_RuntimeException.super_MiniscriptException.location.context.ss)->
            super_RefCountedStorage)._vptr_RefCountedStorage[1])();
        }
      }
    }
  }
  RawDataHandleStorage::resize((RawDataHandleStorage *)local_c8.data.ref,(long)iVar3);
  MiniScript::IntrinsicResult::ensureStorage((IntrinsicResult *)&MiniScript::IntrinsicResult::Null);
  pLVar1 = MiniScript::IntrinsicResult::Null;
  (context->code).ls = MiniScript::IntrinsicResult::Null;
  if (pLVar1 != (ListStorage<MiniScript::TACLine> *)0x0) {
    plVar5 = &(pLVar1->super_RefCountedStorage).refCount;
    *plVar5 = *plVar5 + 1;
  }
  if ((Temp < local_c8.type) &&
     ((RawDataHandleStorage *)local_c8.data.ref != (RawDataHandleStorage *)0x0)) {
    plVar5 = &(local_c8.data.ref)->refCount;
    *plVar5 = *plVar5 + -1;
    if (*plVar5 == 0) {
      (*((RefCountedStorage *)&(local_c8.data.ref)->_vptr_RefCountedStorage)->
        _vptr_RefCountedStorage[1])();
    }
  }
  if ((Temp < local_48[0]) &&
     ((IntrinsicResultStorage *)local_48._8_8_ != (IntrinsicResultStorage *)0x0)) {
    plVar5 = (long *)(local_48._8_8_ + 8);
    *plVar5 = *plVar5 + -1;
    if (*plVar5 == 0) {
      (*((RefCountedStorage *)local_48._8_8_)->_vptr_RefCountedStorage[1])();
    }
  }
  return (IntrinsicResult)(IntrinsicResultStorage *)context;
}

Assistant:

static IntrinsicResult intrinsic_rawDataResize(Context *context, IntrinsicResult partialResult) {
	Value self = context->GetVar("self");
	long nBytes = context->GetVar("bytes").IntValue();
	if (nBytes < 0) {
		IndexException(String("bytes parameter must be >= 0")).raise();
	}
	Value dataWrapper = self.Lookup(_handle);
	if (dataWrapper.IsNull() or dataWrapper.type != ValueType::Handle) {
		dataWrapper = Value::NewHandle(new RawDataHandleStorage());
		self.GetDict().SetValue(_handle, dataWrapper);
	}
	RawDataHandleStorage *storage = (RawDataHandleStorage*)dataWrapper.data.ref;
	storage->resize(nBytes);
	return IntrinsicResult::Null;
}